

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O2

void OpenMD::Utils::
     deletePointers<std::map<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::pair<int,OpenMD::BendType*>,std::less<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const,std::pair<int,OpenMD::BendType*>>>>>
               (map<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::BendType_*>_>_>_>
                *container)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(container->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 2) + 8))();
    }
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }